

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.cpp
# Opt level: O0

void __thiscall dynamicgraph::Tracer::Tracer(Tracer *this,string *n)

{
  bind_t<int_&,_boost::_mfi::mf2<int_&,_dynamicgraph::Tracer,_int_&,_const_int_&>,_boost::_bi::list3<boost::_bi::value<dynamicgraph::Tracer_*>,_boost::arg<1>,_boost::arg<2>_>_>
  f;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  string local_648;
  allocator<char> local_621;
  string local_620 [39];
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  string local_5b0;
  allocator<char> local_589;
  string local_588 [32];
  code *local_568;
  undefined8 local_560;
  allocator<char> local_551;
  string local_550 [39];
  allocator<char> local_529;
  string local_528;
  string local_508;
  code *local_4e8;
  undefined8 local_4e0;
  allocator<char> local_4d1;
  string local_4d0 [39];
  allocator<char> local_4a9;
  string local_4a8;
  string local_488;
  undefined8 local_468;
  undefined8 local_460;
  allocator<char> local_451;
  string local_450 [39];
  allocator<char> local_429;
  string local_428;
  string local_408;
  undefined8 local_3e8;
  undefined8 local_3e0;
  allocator<char> local_3d1;
  string local_3d0 [39];
  allocator<char> local_3a9;
  string local_3a8;
  string local_388;
  code *local_368;
  undefined8 local_360;
  allocator<char> local_351;
  string local_350 [39];
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  string local_290;
  code *local_270;
  undefined8 local_268;
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230;
  string local_210;
  code *local_1f0;
  undefined8 local_1e8;
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  string local_140;
  undefined1 local_120 [8];
  string doc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  code *local_80;
  undefined8 local_78;
  F local_68;
  undefined8 uStack_60;
  storage2<boost::_bi::value<dynamicgraph::Tracer_*>,_boost::arg<1>_> local_58;
  function2<int_&,_int_&,_int> local_50;
  allocator<char> local_19;
  string *local_18;
  string *n_local;
  Tracer *this_local;
  
  local_18 = n;
  n_local = (string *)this;
  dynamicgraph::Entity::Entity(&this->super_Entity,(string *)n);
  *(undefined ***)this = &PTR__Tracer_0014ff00;
  (this->toTraceSignals).
  super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->toTraceSignals).
  super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->toTraceSignals).
  super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ::list(&this->toTraceSignals);
  std::mutex::mutex(&this->files_mtx);
  this->traceStyle = EACH_TIME;
  this->frequency = 1.0;
  std::__cxx11::string::string((string *)&this->basename);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->suffix,".dat",&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::__cxx11::string::string((string *)&this->rootdir);
  this->namesSet = false;
  (this->files).
  super__List_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->files).
  super__List_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->files).
  super__List_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::list(&this->files);
  (this->names).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->names).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->names).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->names);
  this->play = false;
  this->timeStart = 0;
  local_80 = recordTrigger;
  local_78 = 0;
  boost::
  bind<int&,dynamicgraph::Tracer,int&,int_const&,dynamicgraph::Tracer*,boost::arg<1>,boost::arg<2>>
            (&local_68,(boost *)recordTrigger,0);
  f.f_._8_8_ = uStack_60;
  f.f_.f_ = local_68;
  f.l_.super_storage3<boost::_bi::value<dynamicgraph::Tracer_*>,_boost::arg<1>,_boost::arg<2>_>.
  super_storage2<boost::_bi::value<dynamicgraph::Tracer_*>,_boost::arg<1>_>.
  super_storage1<boost::_bi::value<dynamicgraph::Tracer_*>_>.a1_.t_ =
       (storage3<boost::_bi::value<dynamicgraph::Tracer_*>,_boost::arg<1>,_boost::arg<2>_>)
       (storage3<boost::_bi::value<dynamicgraph::Tracer_*>,_boost::arg<1>,_boost::arg<2>_>)
       local_58.super_storage1<boost::_bi::value<dynamicgraph::Tracer_*>_>.a1_.t_;
  boost::function2<int&,int&,int>::
  function2<boost::_bi::bind_t<int&,boost::_mfi::mf2<int&,dynamicgraph::Tracer,int&,int_const&>,boost::_bi::list3<boost::_bi::value<dynamicgraph::Tracer*>,boost::arg<1>,boost::arg<2>>>>
            ((function2<int&,int&,int> *)&local_50,f,0);
  std::operator+(&local_c0,"Tracer(",n);
  std::operator+(&local_a0,&local_c0,")::triger");
  SignalTimeDependent<int,_int>::SignalTimeDependent
            (&this->triger,&local_50,(SignalArray_const<int> *)&sotNOSIGNAL,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  boost::function2<int_&,_int_&,_int>::~function2(&local_50);
  SignalArray<int>::SignalArray
            ((SignalArray<int> *)((long)&doc.field_2 + 8),
             (SignalBase<int> *)
             ((this->triger).super_TimeDependency<int>._vptr_TimeDependency[-3] +
             (long)&(this->triger).super_TimeDependency<int>._vptr_TimeDependency));
  dynamicgraph::Entity::signalRegistration((SignalArray *)this);
  SignalArray<int>::~SignalArray((SignalArray<int> *)((long)&doc.field_2 + 8));
  std::__cxx11::string::string((string *)local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"Add a new signal to trace.",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"string (signal name)",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"string (filename, empty for default",&local_1b1);
  command::docCommandVoid2(&local_140,&local_160,&local_188,&local_1b0);
  std::__cxx11::string::operator=((string *)local_120,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"add",&local_1d9);
  local_1f0 = addSignalToTraceByName;
  local_1e8 = 0;
  command::makeCommandVoid2<dynamicgraph::Tracer,std::__cxx11::string,std::__cxx11::string>
            ((command *)this,(Tracer *)addSignalToTraceByName,0,(string *)local_120);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"Remove all signals. If necessary, close open files.",&local_231);
  command::docCommandVoid0(&local_210,&local_230);
  std::__cxx11::string::operator=((string *)local_120,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"clear",&local_259);
  local_270 = clearSignalToTrace;
  local_268 = 0;
  command::makeCommandVoid0<dynamicgraph::Tracer>
            ((command *)this,(Tracer *)clearSignalToTrace,0,(string *)local_120);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)local_258);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,
             "Gives the args for file opening, and if signals have been set, open the corresponding files."
             ,&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"string (dirname)",&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"string (prefix)",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"string (suffix)",&local_329);
  command::docCommandVoid3(&local_290,&local_2b0,&local_2d8,&local_300,&local_328);
  std::__cxx11::string::operator=((string *)local_120,(string *)&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_350,"open",&local_351);
  local_368 = openFiles;
  local_360 = 0;
  command::
  makeCommandVoid3<dynamicgraph::Tracer,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((command *)this,(Tracer *)openFiles,0,(string *)local_120);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)local_350);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator(&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"Close all the open files.",&local_3a9);
  command::docCommandVoid0(&local_388,&local_3a8);
  std::__cxx11::string::operator=((string *)local_120,(string *)&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3d0,"close",&local_3d1);
  local_3e0 = 0;
  local_3e8 = 0x49;
  command::makeCommandVoid0<dynamicgraph::Tracer>
            ((command *)this,(Tracer *)0x49,0,(string *)local_120);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)local_3d0);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,
             "If necessary, dump (can be done automatically for some traces type).",&local_429);
  command::docCommandVoid0(&local_408,&local_428);
  std::__cxx11::string::operator=((string *)local_120,(string *)&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_450,"dump",&local_451);
  local_460 = 0;
  local_468 = 0x61;
  command::makeCommandVoid0<dynamicgraph::Tracer>
            ((command *)this,(Tracer *)0x61,0,(string *)local_120);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)local_450);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"Start the tracing process.",&local_4a9);
  command::docCommandVoid0(&local_488,&local_4a8);
  std::__cxx11::string::operator=((string *)local_120,(string *)&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d0,"start",&local_4d1);
  local_4e8 = start;
  local_4e0 = 0;
  command::makeCommandVoid0<dynamicgraph::Tracer>
            ((command *)this,(Tracer *)start,0,(string *)local_120);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)local_4d0);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"Stop temporarily the tracing process.",&local_529);
  command::docCommandVoid0(&local_508,&local_528);
  std::__cxx11::string::operator=((string *)local_120,(string *)&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_550,"stop",&local_551);
  local_568 = stop;
  local_560 = 0;
  command::makeCommandVoid0<dynamicgraph::Tracer>
            ((command *)this,(Tracer *)stop,0,(string *)local_120);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)local_550);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator(&local_551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_588,"getTimeStart",&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"timeStart",&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,"int",&local_5f9);
  command::docDirectGetter(&local_5b0,&local_5d0,&local_5f8);
  command::makeDirectGetter<dynamicgraph::Tracer,int>(this,&this->timeStart,&local_5b0);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)local_588);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator(&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_620,"setTimeStart",&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"timeStart",&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"int",&local_691);
  command::docDirectSetter(&local_648,&local_668,&local_690);
  command::makeDirectSetter<dynamicgraph::Tracer,int>(this,&this->timeStart,&local_648);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)local_620);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  std::__cxx11::string::~string(local_620);
  std::allocator<char>::~allocator(&local_621);
  std::__cxx11::string::~string((string *)local_120);
  return;
}

Assistant:

Tracer::Tracer(const std::string n)
    : Entity(n),
      toTraceSignals(),
      traceStyle(TRACE_STYLE_DEFAULT),
      frequency(1),
      basename(),
      suffix(".dat"),
      rootdir(),
      namesSet(false),
      files(),
      names(),
      play(false),
      timeStart(0),
      triger(boost::bind(&Tracer::recordTrigger, this, _1, _2), sotNOSIGNAL,
             "Tracer(" + n + ")::triger") {
  signalRegistration(triger);

  /* --- Commands --- */
  {
    using namespace dynamicgraph::command;
    std::string doc;

    doc = docCommandVoid2("Add a new signal to trace.", "string (signal name)",
                          "string (filename, empty for default");
    addCommand("add",
               makeCommandVoid2(*this, &Tracer::addSignalToTraceByName, doc));

    doc =
        docCommandVoid0("Remove all signals. If necessary, close open files.");
    addCommand("clear",
               makeCommandVoid0(*this, &Tracer::clearSignalToTrace, doc));

    doc = docCommandVoid3(
        "Gives the args for file opening, and "
        "if signals have been set, open the corresponding files.",
        "string (dirname)", "string (prefix)", "string (suffix)");
    addCommand("open", makeCommandVoid3(*this, &Tracer::openFiles, doc));

    doc = docCommandVoid0("Close all the open files.");
    addCommand("close", makeCommandVoid0(*this, &Tracer::closeFiles, doc));

    doc = docCommandVoid0(
        "If necessary, dump "
        "(can be done automatically for some traces type).");
    addCommand("dump", makeCommandVoid0(*this, &Tracer::trace, doc));

    doc = docCommandVoid0("Start the tracing process.");
    addCommand("start", makeCommandVoid0(*this, &Tracer::start, doc));

    doc = docCommandVoid0("Stop temporarily the tracing process.");
    addCommand("stop", makeCommandVoid0(*this, &Tracer::stop, doc));

    addCommand("getTimeStart",
               makeDirectGetter(*this, &timeStart,
                                docDirectGetter("timeStart", "int")));
    addCommand("setTimeStart",
               makeDirectSetter(*this, &timeStart,
                                docDirectSetter("timeStart", "int")));
  }  // using namespace command
}